

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O0

Barcode * __thiscall ZXing::Pdf417::Reader::decode(Reader *this,BinaryBitmap *image)

{
  bool bVar1;
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> *in_RDX;
  long in_RSI;
  Result *in_RDI;
  Barcode *res;
  undefined1 in_stack_00000215;
  undefined1 in_stack_00000216;
  undefined1 in_stack_00000217;
  BinaryBitmap *in_stack_00000218;
  BinaryBitmap *in_stack_000002c8;
  Type in_stack_ffffffffffffff7f;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> *this_00;
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> local_48;
  uint local_30;
  byte local_19;
  vector<ZXing::Result,_std::allocator<ZXing::Result>_> *local_18;
  
  local_18 = in_RDX;
  bVar1 = ReaderOptions::isPure(*(ReaderOptions **)(in_RSI + 8));
  if (bVar1) {
    local_19 = 0;
    DecodePure(in_stack_000002c8);
    Result::error(in_RDI);
    bVar1 = ZXing::operator!=((Error *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                              ,in_stack_ffffffffffffff7f);
    if (bVar1) {
      local_19 = 1;
    }
    local_30 = (uint)bVar1;
    if ((local_19 & 1) == 0) {
      Result::~Result((Result *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    }
    if (local_30 != 0) {
      return in_RDI;
    }
  }
  ReaderOptions::tryRotate(*(ReaderOptions **)(in_RSI + 8));
  ReaderOptions::returnErrors(*(ReaderOptions **)(in_RSI + 8));
  this_00 = &local_48;
  DoDecode(in_stack_00000218,(bool)in_stack_00000217,(bool)in_stack_00000216,(bool)in_stack_00000215
          );
  FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>(local_18);
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

Barcode
Reader::decode(const BinaryBitmap& image) const
{
	if (_opts.isPure()) {
		auto res = DecodePure(image);
		if (res.error() != Error::Checksum)
			return res;
		// This falls through and tries the non-pure code path if we have a checksum error. This approach is
		// currently the best option to deal with 'aliased' input like e.g. 03-aliased.png
	}
	
	return FirstOrDefault(DoDecode(image, false, _opts.tryRotate(), _opts.returnErrors()));
}